

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

NodeIterator __thiscall
DirectChainedMap<IdentifierLookupResult>::next
          (DirectChainedMap<IdentifierLookupResult> *this,NodeIterator it)

{
  Node *start_00;
  Node *pNStack_40;
  uint hash;
  Node *node;
  Node *start;
  DirectChainedMap<IdentifierLookupResult> *this_local;
  NodeIterator it_local;
  
  it_local.start = it.node;
  start_00 = it.start;
  pNStack_40 = *(Node **)(it_local.start + 0x18);
  if (pNStack_40 == start_00) {
    NodeIterator::NodeIterator((NodeIterator *)&it_local.node);
  }
  else {
    do {
      if (pNStack_40 == (Node *)0x0) {
        NodeIterator::NodeIterator((NodeIterator *)&it_local.node);
        return stack0xffffffffffffffe8;
      }
      if (*(int *)pNStack_40 == *(int *)it_local.start) {
        NodeIterator::NodeIterator((NodeIterator *)&it_local.node,start_00,pNStack_40);
        return stack0xffffffffffffffe8;
      }
      pNStack_40 = *(Node **)(pNStack_40 + 0x18);
    } while (pNStack_40 != start_00);
    NodeIterator::NodeIterator((NodeIterator *)&it_local.node);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

NodeIterator next(NodeIterator it)
	{
		Node *start = it.start;
		Node *node = it.node;

		unsigned hash = node->hash;

		node = node->next;

		if(node == start)
			return NodeIterator();

		while(node)
		{
			if(node->hash == hash)
				return NodeIterator(start, node);

			node = node->next;

			if(node == start)
				return NodeIterator();
		}

		return NodeIterator();
	}